

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

Vec_Int_t * Sle_ManComputeCuts(Gia_Man_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  p_01 = Vec_IntAlloc(iVar1 * 0x1e);
  if (6 < nLutSize) {
    __assert_fail("nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                  ,0xd2,"Vec_Int_t *Sle_ManComputeCuts(Gia_Man_t *, int, int)");
  }
  Vec_IntFill(p_01,p->nObjs,0);
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,iVar1);
    pGVar4 = Gia_ManObj(p,iVar2);
    iVar2 = Gia_ObjId(p,pGVar4);
    if (iVar2 == 0) break;
    Vec_IntWriteEntry(p_01,iVar2,p_01->nSize);
    Vec_IntPush(p_01,0);
    Vec_IntPush(p_01,(0x10 << ((byte)(iVar2 % 0x1c) & 0x1f)) + 1);
    Vec_IntPush(p_01,iVar2);
  }
  uVar5 = 0;
  for (iVar1 = 0; iVar2 = p->nObjs, iVar1 < iVar2; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManObj(p,iVar1);
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Sle_ManCutMerge(p,iVar1,p_01,p_00,nLutSize);
      uVar5 = uVar5 + iVar2;
    }
  }
  if (fVerbose != 0) {
    uVar3 = Gia_ManAndNum(p);
    iVar1 = p_01->nCap;
    auVar6._8_4_ = iVar1 >> 0x1f;
    auVar6._0_8_ = (long)iVar1;
    auVar6._12_4_ = 0x45300000;
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n",
           (double)(int)uVar5 / (double)(int)uVar3,
           (double)(p_01->nSize - iVar2) / (double)(int)uVar3,
           (((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0) *
           9.5367431640625e-07,(ulong)uVar3,(ulong)uVar5);
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Sle_ManComputeCuts( Gia_Man_t * p, int nLutSize, int fVerbose )
{
    int i, iObj, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    assert( nLutSize <= 6 );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManForEachCiId( p, iObj, i )
    {
        Vec_IntWriteEntry( vCuts, iObj, Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 0 );
        Vec_IntPush( vCuts, Sle_CutSetSizeSign(1, 1<<(iObj % 28)) );
        Vec_IntPush( vCuts, iObj );
    }
    Gia_ManForEachAndId( p, iObj )
        nCuts += Sle_ManCutMerge( p, iObj, vCuts, vTemp, nLutSize );
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 
            1.0*(Vec_IntSize(vCuts)-Gia_ManObjNum(p))/Gia_ManAndNum(p), 
            1.0*Vec_IntMemory(vCuts) / (1<<20) );
    Vec_IntFree( vTemp );
    return vCuts;
}